

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::MakeInputsBeProtoPathRelative
          (CommandLineInterface *this,DiskSourceTree *source_tree)

{
  pointer pbVar1;
  undefined4 uVar2;
  int iVar3;
  ostream *poVar4;
  int *piVar5;
  long lVar6;
  string *psVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  string shadowing_disk_file;
  string virtual_file;
  
  lVar6 = 0;
  uVar8 = 0;
LAB_0013fd7b:
  pbVar1 = (this->input_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)(this->input_files_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
  if (uVar8 < uVar10) {
    virtual_file._M_dataplus._M_p = (pointer)&virtual_file.field_2;
    virtual_file._M_string_length = 0;
    shadowing_disk_file._M_dataplus._M_p = (pointer)&shadowing_disk_file.field_2;
    shadowing_disk_file._M_string_length = 0;
    virtual_file.field_2._M_local_buf[0] = '\0';
    shadowing_disk_file.field_2._M_local_buf[0] = '\0';
    uVar2 = google::protobuf::compiler::DiskSourceTree::DiskFileToVirtualFile
                      ((string *)source_tree,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar6),
                       (string *)&virtual_file);
    switch(uVar2) {
    case 0:
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)&(((this->input_files_).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6));
      goto switchD_0013fdea_default;
    case 1:
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               (string *)
                               ((long)&(((this->input_files_).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar6));
      poVar4 = std::operator<<(poVar4,": Input is shadowed in the --proto_path by \"");
      poVar4 = std::operator<<(poVar4,(string *)&shadowing_disk_file);
      pcVar9 = 
      "\".  Either use the latter file as your input or reorder the --proto_path so that the former file\'s location comes first."
      ;
      break;
    case 2:
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               (string *)
                               ((long)&(((this->input_files_).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar6));
      poVar4 = std::operator<<(poVar4,": ");
      piVar5 = __errno_location();
      iVar3 = *piVar5;
LAB_0013feeb:
      pcVar9 = strerror(iVar3);
      poVar4 = std::operator<<(poVar4,pcVar9);
      goto LAB_0013fefb;
    case 3:
      iVar3 = access(*(char **)((long)&(((this->input_files_).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar6),0);
      psVar7 = (string *)
               ((long)&(((this->input_files_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6);
      if (iVar3 < 0) {
        poVar4 = std::operator<<((ostream *)&std::cerr,psVar7);
        poVar4 = std::operator<<(poVar4,": ");
        iVar3 = 2;
        goto LAB_0013feeb;
      }
      poVar4 = std::operator<<((ostream *)&std::cerr,psVar7);
      pcVar9 = 
      ": File does not reside within any path specified using --proto_path (or -I).  You must specify a --proto_path which encompasses this file.  Note that the proto_path must be an exact prefix of the .proto file names -- protoc is too dumb to figure out when two paths (e.g. absolute and relative) are equivalent (it\'s harder than you think)."
      ;
      break;
    default:
      goto switchD_0013fdea_default;
    }
    poVar4 = std::operator<<(poVar4,pcVar9);
LAB_0013fefb:
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&shadowing_disk_file);
    std::__cxx11::string::~string((string *)&virtual_file);
  }
  return uVar10 <= uVar8;
switchD_0013fdea_default:
  std::__cxx11::string::~string((string *)&shadowing_disk_file);
  std::__cxx11::string::~string((string *)&virtual_file);
  uVar8 = uVar8 + 1;
  lVar6 = lVar6 + 0x20;
  goto LAB_0013fd7b;
}

Assistant:

bool CommandLineInterface::MakeInputsBeProtoPathRelative(
    DiskSourceTree* source_tree) {
  for (int i = 0; i < input_files_.size(); i++) {
    string virtual_file, shadowing_disk_file;
    switch (source_tree->DiskFileToVirtualFile(
        input_files_[i], &virtual_file, &shadowing_disk_file)) {
      case DiskSourceTree::SUCCESS:
        input_files_[i] = virtual_file;
        break;
      case DiskSourceTree::SHADOWED:
        cerr << input_files_[i] << ": Input is shadowed in the --proto_path "
                "by \"" << shadowing_disk_file << "\".  Either use the latter "
                "file as your input or reorder the --proto_path so that the "
                "former file's location comes first." << endl;
        return false;
      case DiskSourceTree::CANNOT_OPEN:
        cerr << input_files_[i] << ": " << strerror(errno) << endl;
        return false;
      case DiskSourceTree::NO_MAPPING:
        // First check if the file exists at all.
        if (access(input_files_[i].c_str(), F_OK) < 0) {
          // File does not even exist.
          cerr << input_files_[i] << ": " << strerror(ENOENT) << endl;
        } else {
          cerr << input_files_[i] << ": File does not reside within any path "
                  "specified using --proto_path (or -I).  You must specify a "
                  "--proto_path which encompasses this file.  Note that the "
                  "proto_path must be an exact prefix of the .proto file "
                  "names -- protoc is too dumb to figure out when two paths "
                  "(e.g. absolute and relative) are equivalent (it's harder "
                  "than you think)." << endl;
        }
        return false;
    }
  }

  return true;
}